

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

bool __thiscall QHttp2Connection::sendPing(QHttp2Connection *this)

{
  bool bVar1;
  array<char,_8UL> *c;
  long in_FS_OFFSET;
  QRandomGenerator gen;
  array<char,_8UL> data;
  quint32 in_stack_fffffffffffff5dc;
  char *end;
  QRandomGenerator *this_00;
  undefined7 in_stack_fffffffffffff600;
  undefined1 in_stack_fffffffffffff607;
  char local_9e0 [48];
  QByteArrayView in_stack_fffffffffffff650;
  uint local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaa;
  uStack_c = 0xaaaaaaaa;
  end = local_9e0;
  memset(end,0xaa,0x9d0);
  QRandomGenerator::QRandomGenerator((QRandomGenerator *)0x2b6a25,in_stack_fffffffffffff5dc);
  this_00 = (QRandomGenerator *)&stack0xfffffffffffffff0;
  c = (array<char,_8UL> *)std::array<char,_8UL>::begin((array<char,_8UL> *)0x2b6a37);
  std::array<char,_8UL>::end((array<char,_8UL> *)0x2b6a46);
  QRandomGenerator::generate<char*>(this_00,c->_M_elems,end);
  QByteArrayView::QByteArrayView<std::array<char,_8UL>,_true>((QByteArrayView *)this_00,c);
  bVar1 = sendPing((QHttp2Connection *)CONCAT17(in_stack_fffffffffffff607,in_stack_fffffffffffff600)
                   ,in_stack_fffffffffffff650);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Connection::sendPing()
{
    std::array<char, 8> data;

    QRandomGenerator gen;
    gen.generate(data.begin(), data.end());
    return sendPing(data);
}